

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_set_tile_dim(fitsfile *fptr,int ndim,long *dims,int *status)

{
  ulong uVar1;
  
  if ((uint)ndim < 7) {
    for (uVar1 = 0; (uint)ndim != uVar1; uVar1 = uVar1 + 1) {
      fptr->Fptr->request_tilesize[uVar1] = dims[uVar1];
    }
  }
  else {
    *status = 0x140;
    ffpmsg("illegal number of tile dimensions (fits_set_tile_dim)");
  }
  return *status;
}

Assistant:

int fits_set_tile_dim(fitsfile *fptr,  /* I - FITS file pointer             */
           int ndim,   /* number of dimensions in the compressed image      */
           long *dims, /* size of image compression tile in each dimension  */
                      /* default tile size = (NAXIS1, 1, 1, ...)            */
           int *status)         /* IO - error status                        */
{
/*
   This routine specifies the size (dimension) of the image
   compression  tiles that should be used when writing a FITS
   image.  The image is divided into tiles, and each tile is compressed
   and stored in a row of at variable length binary table column.
*/
    int ii;

    if (ndim < 0 || ndim > MAX_COMPRESS_DIM)
    {
        *status = BAD_DIMEN;
	ffpmsg("illegal number of tile dimensions (fits_set_tile_dim)");
        return(*status);
    }

    for (ii = 0; ii < ndim; ii++)
    {
        (fptr->Fptr)->request_tilesize[ii] = dims[ii];
    }

    return(*status);
}